

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track.c
# Opt level: O1

double sync_get_val(sync_track *t,double row)

{
  track_key *ptVar1;
  uint uVar2;
  track_key *ptVar3;
  uint uVar4;
  double dVar5;
  
  if (t->num_keys == 0) {
    return 0.0;
  }
  dVar5 = floor(row);
  uVar2 = sync_find_key(t,(int)dVar5);
  uVar4 = -uVar2 - 2;
  if (-1 < (int)uVar2) {
    uVar4 = uVar2;
  }
  if ((int)uVar4 < 0) {
    ptVar3 = t->keys;
switchD_001ab8c9_caseD_0:
    dVar5 = (double)ptVar3->value;
  }
  else {
    ptVar1 = t->keys;
    if (t->num_keys + -2 < (int)uVar4) {
      return (double)ptVar1[(long)t->num_keys + -1].value;
    }
    if (KEY_RAMP < ptVar1[uVar4].type) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/3p/rocket/lib/track.c"
                    ,0x39,"double sync_get_val(const struct sync_track *, double)");
    }
    ptVar3 = ptVar1 + uVar4;
    switch(ptVar1[uVar4].type) {
    case KEY_STEP:
      goto switchD_001ab8c9_caseD_0;
    case KEY_LINEAR:
      dVar5 = (row - (double)ptVar3->row) / (double)(ptVar3[1].row - ptVar3->row);
      break;
    case KEY_SMOOTH:
      dVar5 = (row - (double)ptVar3->row) / (double)(ptVar3[1].row - ptVar3->row);
      return (double)(ptVar3[1].value - ptVar3->value) * (3.0 - (dVar5 + dVar5)) * dVar5 * dVar5 +
             (double)ptVar3->value;
    case KEY_RAMP:
      dVar5 = (row - (double)ptVar3->row) / (double)(ptVar3[1].row - ptVar3->row);
      dVar5 = dVar5 * dVar5;
    }
    dVar5 = (double)(ptVar3[1].value - ptVar3->value) * dVar5 + (double)ptVar3->value;
  }
  return dVar5;
}

Assistant:

double sync_get_val(const struct sync_track *t, double row)
{
	int idx, irow;

	/* If we have no keys at all, return a constant 0 */
	if (!t->num_keys)
		return 0.0f;

	irow = (int)floor(row);
	idx = key_idx_floor(t, irow);

	/* at the edges, return the first/last value */
	if (idx < 0)
		return t->keys[0].value;
	if (idx > (int)t->num_keys - 2)
		return t->keys[t->num_keys - 1].value;

	/* interpolate according to key-type */
	switch (t->keys[idx].type) {
	case KEY_STEP:
		return t->keys[idx].value;
	case KEY_LINEAR:
		return key_linear(t->keys + idx, row);
	case KEY_SMOOTH:
		return key_smooth(t->keys + idx, row);
	case KEY_RAMP:
		return key_ramp(t->keys + idx, row);
	default:
		assert(0);
		return 0.0f;
	}
}